

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawBrandedSchema * __thiscall capnp::SchemaLoader::Impl::getUnbound(Impl *this,RawSchema *schema)

{
  Maybe<capnp::_::RawBrandedSchema_*&> MVar1;
  RawBrandedSchema *pRVar2;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar3;
  RawSchema *local_88;
  StructReader local_80;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_50;
  PointerReader local_38;
  
  local_38.pointer = (WirePointer *)schema->encodedNode;
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  local_88 = schema;
  _::PointerReader::getStruct(&local_80,&local_38,(word *)0x0);
  if ((local_80.dataSize < 0x121) || ((*(byte *)((long)local_80.data + 0x24) & 1) == 0)) {
    pRVar2 = &schema->defaultBrand;
  }
  else {
    MVar1 = kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::
            find<capnp::_::RawSchema_const*&>
                      ((HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*> *)
                       &this->unboundBrands,&local_88);
    if (MVar1.ptr == (RawBrandedSchema **)0x0) {
      pRVar2 = (RawBrandedSchema *)kj::Arena::allocateBytes(&this->arena,0x28,8,false);
      pRVar2->scopes = (Scope *)0x0;
      pRVar2->dependencies = (Dependency *)0x0;
      pRVar2->scopeCount = 0;
      pRVar2->dependencyCount = 0;
      pRVar2->lazyInitializer = (Initializer *)0x0;
      pRVar2->generic = local_88;
      local_50.ptr.isSet = false;
      AVar3 = makeBrandedDependencies(this,local_88,&local_50);
      pRVar2->dependencies = AVar3.ptr;
      pRVar2->dependencyCount = (uint32_t)AVar3.size_;
      local_80.segment = (SegmentReader *)local_88;
      local_80.capTable = (CapTableReader *)pRVar2;
      kj::
      Table<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry,_kj::HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>_>
      ::insert(&(this->unboundBrands).table,(Entry *)&local_80);
    }
    else {
      pRVar2 = *MVar1.ptr;
    }
  }
  return pRVar2;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::getUnbound(const _::RawSchema* schema) {
  if (!readMessageUnchecked<schema::Node>(schema->encodedNode).getIsGeneric()) {
    // Not a generic type, so just return the default brand.
    return &schema->defaultBrand;
  }

  KJ_IF_MAYBE(existing, unboundBrands.find(schema)) {
    return *existing;
  } else {
    auto slot = &arena.allocate<_::RawBrandedSchema>();
    memset(slot, 0, sizeof(*slot));
    slot->generic = schema;
    auto deps = makeBrandedDependencies(schema, nullptr);
    slot->dependencies = deps.begin();
    slot->dependencyCount = deps.size();
    unboundBrands.insert(schema, slot);
    return slot;
  }